

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_stores(void)

{
  store_conflict *psVar1;
  uint8_t local_24;
  object *local_20;
  object *obj;
  store *store;
  wchar_t i;
  
  wr_u16b(z_info->store_max);
  for (store._4_4_ = 0; psVar1 = stores, store._4_4_ < (int)(uint)z_info->store_max;
      store._4_4_ = store._4_4_ + 1) {
    if (stores[store._4_4_].owner == (owner *)0x0) {
      local_24 = '\0';
    }
    else {
      local_24 = (uint8_t)(stores[store._4_4_].owner)->oidx;
    }
    wr_byte(local_24);
    wr_byte(psVar1[store._4_4_].stock_num);
    for (local_20 = psVar1[store._4_4_].stock; local_20 != (object *)0x0; local_20 = local_20->next)
    {
      wr_item(local_20->known);
      wr_item(local_20);
    }
  }
  return;
}

Assistant:

void wr_stores(void)
{
	int i;

	wr_u16b(z_info->store_max);
	for (i = 0; i < z_info->store_max; i++) {
		const struct store *store = &stores[i];
		struct object *obj;

		/* Save the current owner */
		wr_byte((store->owner) ? store->owner->oidx : 0);

		/* Save the stock size */
		wr_byte(store->stock_num);

		/* Save the stock */
		for (obj = store->stock; obj; obj = obj->next) {
			wr_item(obj->known);
			wr_item(obj);
		}
	}
}